

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManSimPatResim(Gia_Man_t *pGia,Vec_Int_t *vObjs,int nWords,Vec_Wrd_t *vSims)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  word *pwVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar1 = vObjs->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vObjs->pArray;
    uVar11 = (ulong)(uint)nWords;
    lVar12 = 0;
    do {
      iVar2 = piVar3[lVar12];
      if (((long)iVar2 < 0) || (iVar8 = pGia->nObjs, iVar8 <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (lVar12 == 0) {
        if (iVar8 <= iVar2) {
LAB_007c70b5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (0 < nWords) {
          pwVar5 = vSims->pArray;
          uVar7 = 0;
          do {
            pwVar5[(long)(iVar2 * nWords) + uVar7] = ~pwVar5[(long)(iVar2 * nWords) + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
      }
      else {
        uVar7 = *(ulong *)(pGia->pObjs + iVar2);
        uVar6 = (uint)uVar7;
        iVar10 = (int)(uVar7 & 0x1fffffff);
        if ((uVar7 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
          if ((-1 < (int)uVar6) || (iVar10 == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                          ,0x91,
                          "void Gia_ManSimPatResim(Gia_Man_t *, Vec_Int_t *, int, Vec_Wrd_t *)");
          }
        }
        else {
          if (iVar8 <= iVar2) goto LAB_007c70b5;
          uVar4 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar7 >> 0x1a) & 8));
          uVar13 = (uint)(uVar7 >> 0x20);
          uVar7 = Cnf_CutDeriveTruth::C[uVar13 >> 0x1d & 1];
          pwVar5 = vSims->pArray;
          iVar8 = (iVar2 - (uVar6 & 0x1fffffff)) * nWords;
          uVar13 = uVar13 & 0x1fffffff;
          iVar9 = (iVar2 - uVar13) * nWords;
          if ((uVar6 & 0x1fffffff) < uVar13 && (iVar10 != 0x1fffffff && -1 < (int)uVar6)) {
            if (0 < nWords) {
              uVar14 = 0;
              do {
                pwVar5[(long)(iVar2 * nWords) + uVar14] =
                     pwVar5[(long)iVar8 + uVar14] ^ pwVar5[(long)iVar9 + uVar14] ^ uVar4 ^ uVar7;
                uVar14 = uVar14 + 1;
              } while (uVar11 != uVar14);
            }
          }
          else if (0 < nWords) {
            uVar14 = 0;
            do {
              pwVar5[(long)(iVar2 * nWords) + uVar14] =
                   (pwVar5[(long)iVar9 + uVar14] ^ uVar7) & (pwVar5[(long)iVar8 + uVar14] ^ uVar4);
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
  }
  return;
}

Assistant:

void Gia_ManSimPatResim( Gia_Man_t * pGia, Vec_Int_t * vObjs, int nWords, Vec_Wrd_t * vSims )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachObjVec( vObjs, pGia, pObj, i )
        if ( i == 0 )
            Gia_ManSimPatSimNot( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimPatSimAnd( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( !Gia_ObjIsCo(pObj) ) assert(0);
}